

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

int adios2::utils::print_data_as_string(void *data,int maxlen,DataType adiosvartype)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if ((adiosvartype < Char) && ((0x4022U >> (adiosvartype & (Struct|Char)) & 1) != 0)) {
    pcVar3 = (char *)((long)maxlen + (long)data);
    uVar6 = 0xffffffff;
    do {
      uVar4 = uVar6;
      pcVar1 = pcVar3 + -1;
      pcVar3 = pcVar3 + -1;
      uVar6 = uVar4 + 1;
    } while (*pcVar1 == '\0');
    if ((int)(maxlen - (uVar4 + 1)) < maxlen) {
      iVar5 = 0;
      fprintf(outf,"\"%s\"",data);
    }
    else {
      do {
        uVar4 = uVar4 + 1;
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + -1;
      } while (cVar2 == ' ');
      uVar6 = maxlen - uVar4;
      iVar5 = 0;
      fprintf(outf,"\"%*.*s\"",(ulong)uVar6,(ulong)uVar6);
      if ((int)uVar6 < maxlen) {
        iVar5 = 0;
        fprintf(outf," + %d spaces",(ulong)uVar4);
      }
    }
  }
  else {
    fprintf(_stderr,"Error in bpls code: cannot use print_data_as_string() for type \"%d\"\n");
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int print_data_as_string(const void *data, int maxlen, DataType adiosvartype)
{
    const char *str = (const char *)data;
    int len = maxlen;
    switch (adiosvartype)
    {
    case DataType::UInt8:
    case DataType::Int8:
    case DataType::String:
        while (str[len - 1] == 0)
        {
            len--;
        } // go backwards on ascii 0s
        if (len < maxlen)
        {
            // it's a C string with terminating \0
            fprintf(outf, "\"%s\"", str);
        }
        else
        {
            // fortran VARCHAR, lets trim from right padded zeros
            while (str[len - 1] == ' ')
            {
                len--;
            }
            fprintf(outf, "\"%*.*s\"", len, len, (char *)data);
            if (len < maxlen)
                fprintf(outf, " + %d spaces", maxlen - len);
        }
        break;
    default:
        fprintf(stderr,
                "Error in bpls code: cannot use print_data_as_string() "
                "for type \"%d\"\n",
                static_cast<typename std::underlying_type<DataType>::type>(adiosvartype));
        return -1;
    }
    return 0;
}